

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

string * __thiscall
glcts::ViewportArray::ViewportIndexSubroutine::getGeometryShader_abi_cxx11_
          (string *__return_storage_ptr__,ViewportIndexSubroutine *this)

{
  GLchar *__s;
  allocator<char> local_1a;
  undefined1 local_19;
  ViewportIndexSubroutine *local_18;
  ViewportIndexSubroutine *this_local;
  string *result;
  
  __s = getGeometryShader::source;
  local_19 = 0;
  local_18 = this;
  this_local = (ViewportIndexSubroutine *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_1a)
  ;
  std::allocator<char>::~allocator(&local_1a);
  return __return_storage_ptr__;
}

Assistant:

std::string ViewportIndexSubroutine::getGeometryShader()
{
	static const GLchar* source = "${VERSION}\n"
								  "\n"
								  "${GEOMETRY_SHADER_ENABLE}\n"
								  "${VIEWPORT_ARRAY_ENABLE}\n"
								  "\n"
								  "layout(points, invocations = 1)          in;\n"
								  "layout(triangle_strip, max_vertices = 4) out;\n"
								  "\n"
								  "flat out int gs_fs_color;\n"
								  "\n"
								  "subroutine void indexSetter(void);\n"
								  "\n"
								  "subroutine(indexSetter) void four()\n"
								  "{\n"
								  "    gs_fs_color      = 4;\n"
								  "    gl_ViewportIndex = 4;\n"
								  "}\n"
								  "\n"
								  "subroutine(indexSetter) void five()\n"
								  "{\n"
								  "    gs_fs_color      = 5;\n"
								  "    gl_ViewportIndex = 5;\n"
								  "}\n"
								  "\n"
								  "subroutine uniform indexSetter routine;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    routine();\n"
								  "    gl_Position  = vec4(-1, -1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "    routine();\n"
								  "    gl_Position  = vec4(-1, 1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "    routine();\n"
								  "    gl_Position  = vec4(1, -1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "    routine();\n"
								  "    gl_Position  = vec4(1, 1, 0, 1);\n"
								  "    EmitVertex();\n"
								  "}\n"
								  "\n";

	std::string result = source;

	return result;
}